

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O2

void __thiscall amrex::MLNodeLinOp::setOversetMask(MLNodeLinOp *this,int amrlev,iMultiFab *a_dmask)

{
  int iVar1;
  int iVar2;
  int j;
  int iVar3;
  Box local_12c;
  Array4<int> local_110;
  Array4<const_int> local_d0;
  MFIter mfi;
  
  MFIter::MFIter(&mfi,(FabArrayBase *)
                      **(undefined8 **)
                        &(this->m_dirichlet_mask).
                         super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[amrlev].
                         super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                         .
                         super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                 ,true);
  while (mfi.currentIndex < mfi.endIndex) {
    FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
              (&local_d0,&a_dmask->super_FabArray<amrex::IArrayBox>,&mfi);
    FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>
              (&local_110,
               (FabArray<amrex::IArrayBox> *)
               **(undefined8 **)
                 &(this->m_dirichlet_mask).
                  super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                  .
                  super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[amrlev].
                  super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                  .
                  super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               ,&mfi);
    MFIter::tilebox(&local_12c,&mfi);
    for (iVar2 = local_12c.smallend.vect[2]; iVar2 <= local_12c.bigend.vect[2]; iVar2 = iVar2 + 1) {
      for (iVar3 = local_12c.smallend.vect[1]; iVar3 <= local_12c.bigend.vect[1]; iVar3 = iVar3 + 1)
      {
        iVar1 = local_12c.smallend.vect[0];
        if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
          do {
            local_110.p
            [((long)iVar3 - (long)local_110.begin.y) * local_110.jstride +
             (long)(iVar1 - local_110.begin.x) +
             ((long)iVar2 - (long)local_110.begin.z) * local_110.kstride] =
                 1 - local_d0.p
                     [((long)iVar3 - (long)local_d0.begin.y) * local_d0.jstride +
                      (long)(iVar1 - local_d0.begin.x) +
                      ((long)iVar2 - (long)local_d0.begin.z) * local_d0.kstride];
            iVar1 = iVar1 + 1;
          } while (local_12c.bigend.vect[0] + 1 != iVar1);
        }
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  this->m_overset_dirichlet_mask = true;
  return;
}

Assistant:

void
MLNodeLinOp::setOversetMask (int amrlev, const iMultiFab& a_dmask)
{
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(*m_dirichlet_mask[amrlev][0], TilingIfNotGPU()); mfi.isValid(); ++mfi) {
        Array4<int const> const& omsk = a_dmask.const_array(mfi);
        Array4<int> const& dmsk = m_dirichlet_mask[amrlev][0]->array(mfi);
        Box const& bx = mfi.tilebox();
        AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
        {
            dmsk(i,j,k) = 1 - omsk(i,j,k);
        });
    }
    m_overset_dirichlet_mask = true;
}